

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGElementMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlNodePtr elem)

{
  xmlNs *pxVar1;
  xmlRelaxNGDefinePtr pxVar2;
  xmlGenericErrorFunc p_Var3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  int iVar5;
  int iVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlChar *arg2;
  xmlChar *pxVar9;
  uint uVar10;
  xmlRelaxNGValidErr err;
  xmlRelaxNGDefinePtr *ppxVar11;
  
  if ((define->name == (xmlChar *)0x0) || (iVar5 = xmlStrEqual(elem->name,define->name), iVar5 != 0)
     ) {
    pxVar9 = define->ns;
    if (pxVar9 == (xmlChar *)0x0) {
      if ((elem->ns != (xmlNs *)0x0) && (pxVar9 = define->name, pxVar9 != (xmlChar *)0x0)) {
LAB_0017344d:
        err = XML_RELAXNG_ERR_ELEMEXTRANS;
LAB_0017348a:
        arg2 = (xmlChar *)0x0;
        goto LAB_00173490;
      }
    }
    else {
      pxVar1 = elem->ns;
      if (*pxVar9 == '\0') {
        if (pxVar1 != (xmlNs *)0x0) {
          pxVar9 = define->name;
          if (pxVar9 == (xmlChar *)0x0) {
            pxVar9 = elem->name;
          }
          goto LAB_0017344d;
        }
      }
      else {
        if (pxVar1 == (xmlNs *)0x0) {
          pxVar9 = elem->name;
          err = XML_RELAXNG_ERR_ELEMNONS;
          goto LAB_0017348a;
        }
        iVar5 = xmlStrEqual(pxVar1->href,pxVar9);
        if (iVar5 == 0) {
          pxVar9 = elem->name;
          arg2 = define->ns;
          err = XML_RELAXNG_ERR_ELEMWRONGNS;
          goto LAB_00173490;
        }
      }
    }
    pxVar2 = define->nameClass;
    iVar5 = 1;
    if (pxVar2 != (xmlRelaxNGDefinePtr)0x0) {
      if (pxVar2->type == XML_RELAXNG_CHOICE) {
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = ctxt->flags;
          ctxt->flags = uVar10 | 1;
        }
        ppxVar11 = &pxVar2->nameClass;
        do {
          pxVar4 = *ppxVar11;
          if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            iVar5 = 0;
            if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
              return 0;
            }
            if (0 < ctxt->errNr) {
              xmlRelaxNGPopErrors(ctxt,0);
            }
            goto LAB_00173569;
          }
          iVar6 = xmlRelaxNGElementMatch(ctxt,pxVar4,elem);
          if (iVar6 == 1) goto LAB_00173560;
          ppxVar11 = &pxVar4->next;
        } while (-1 < iVar6);
      }
      else {
        if (pxVar2->type != XML_RELAXNG_EXCEPT) {
          pp_Var7 = __xmlGenericError();
          p_Var3 = *pp_Var7;
          ppvVar8 = __xmlGenericErrorContext();
          (*p_Var3)(*ppvVar8,"Unimplemented block at %s:%d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c"
                    ,0x2624);
          return -1;
        }
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = ctxt->flags;
          ctxt->flags = uVar10 | 1;
        }
        ppxVar11 = &pxVar2->content;
        do {
          pxVar4 = *ppxVar11;
          if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) goto LAB_00173560;
          iVar6 = xmlRelaxNGElementMatch(ctxt,pxVar4,elem);
          if (iVar6 == 1) {
            iVar5 = 0;
            goto LAB_00173560;
          }
          ppxVar11 = &pxVar4->next;
        } while (-1 < iVar6);
      }
      iVar5 = -1;
LAB_00173560:
      if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
LAB_00173569:
        ctxt->flags = uVar10;
      }
    }
  }
  else {
    pxVar9 = define->name;
    arg2 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNAME;
LAB_00173490:
    iVar5 = 0;
    xmlRelaxNGAddValidError(ctxt,err,pxVar9,arg2,0);
  }
  return iVar5;
}

Assistant:

static int
xmlRelaxNGElementMatch(xmlRelaxNGValidCtxtPtr ctxt,
                       xmlRelaxNGDefinePtr define, xmlNodePtr elem)
{
    int ret = 0, oldflags = 0;

    if (define->name != NULL) {
        if (!xmlStrEqual(elem->name, define->name)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMNAME, define->name, elem->name);
            return (0);
        }
    }
    if ((define->ns != NULL) && (define->ns[0] != 0)) {
        if (elem->ns == NULL) {
            VALID_ERR2(XML_RELAXNG_ERR_ELEMNONS, elem->name);
            return (0);
        } else if (!xmlStrEqual(elem->ns->href, define->ns)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMWRONGNS,
                       elem->name, define->ns);
            return (0);
        }
    } else if ((elem->ns != NULL) && (define->ns != NULL) &&
               (define->name == NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, elem->name);
        return (0);
    } else if ((elem->ns != NULL) && (define->name != NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, define->name);
        return (0);
    }

    if (define->nameClass == NULL)
        return (1);

    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (0);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        ret = 1;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (1);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        if (ctxt != NULL) {
            if (ret != 0) {
                if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                    xmlRelaxNGDumpValidError(ctxt);
            } else {
                if (ctxt->errNr > 0)
                    xmlRelaxNGPopErrors(ctxt, 0);
            }
        }
        ret = 0;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else {
        TODO ret = -1;
    }
    return (ret);
}